

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_TextureMapping::MappingCRC(ON_TextureMapping *this)

{
  ON_Object *pOVar1;
  ON__UINT32 OVar2;
  ON__UINT32 mapping_crc_00;
  ON_UserData *pOVar3;
  MappingCRCCache *this_00;
  ON_UserData *p;
  ON__UINT32 mapping_crc;
  undefined1 auStack_34 [12];
  
  p = (ON_UserData *)&mapping_crc;
  OVar2 = ON_CRC32(0x12345678,4,&this->m_type);
  if (this->m_type == srfp_mapping) {
    OVar2 = OVar2 + 1;
  }
  else {
    OVar2 = ON_CRC32(OVar2,4,&this->m_projection);
    OVar2 = ON_CRC32(OVar2,4,&this->m_texture_space);
    OVar2 = ON_CRC32(OVar2,1,&this->m_bCapped);
    OVar2 = ON_CRC32(OVar2,0x80,&this->m_Pxyz);
    pOVar1 = (this->m_mapping_primitive).
             super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pOVar1 != (ON_Object *)0x0) {
      _mapping_crc = ON_ClassId::Uuid(&MappingCRCCache::m_MappingCRCCache_class_rtti);
      pOVar3 = ON_Object::GetUserData(pOVar1,(ON_UUID *)&mapping_crc);
      if (pOVar3 == (ON_UserData *)0x0) {
        mapping_crc_00 =
             ::MappingCRC((this->m_mapping_primitive).
                          super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        mapping_crc = mapping_crc_00;
        pOVar1 = (this->m_mapping_primitive).
                 super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (MappingCRCCache *)operator_new(0xd0);
        MappingCRCCache::MappingCRCCache(this_00,mapping_crc_00);
        ON_Object::AttachUserData(pOVar1,(ON_UserData *)this_00);
      }
      else {
        p = pOVar3 + 1;
      }
      OVar2 = ON_CRC32(OVar2,4,p);
    }
  }
  OVar2 = ON_CRC32(OVar2,0x80,&this->m_uvw);
  return OVar2;
}

Assistant:

ON__UINT32 ON_TextureMapping::MappingCRC() const
{
  // include any member that can change values returned by Evaluate
  ON__UINT32 crc32 = 0x12345678;
  crc32 = ON_CRC32(crc32,sizeof(m_type),&m_type);
  if ( ON_TextureMapping::TYPE::srfp_mapping != m_type )
  {
    // As of 21 June 2006 m_Pxyz cannot effect ON_TextureMapping::TYPE::srfp_mapping,
    // so it shouldn't be included in the CRC for srfp_mappings.
    crc32 = ON_CRC32(crc32,sizeof(m_projection),    &m_projection);
    crc32 = ON_CRC32(crc32,sizeof(m_texture_space), &m_texture_space);
    crc32 = ON_CRC32(crc32,sizeof(m_bCapped),		    &m_bCapped);
    crc32 = ON_CRC32(crc32,sizeof(m_Pxyz),          &m_Pxyz);
    // do not include m_Nxyz here - it won't help and may hurt

    if (m_mapping_primitive)
    {
      const auto* pUD = static_cast<MappingCRCCache*>(m_mapping_primitive->GetUserData(ON_CLASS_ID(MappingCRCCache)));
      if (pUD)
      {
        crc32 = ON_CRC32(crc32, sizeof(MappingCRCCache::m_mapping_crc), &pUD->m_mapping_crc);
      }
      else
      {
        //Existing files.
        const auto mapping_crc = ::MappingCRC(m_mapping_primitive.get());
        const_cast<ON_Object*>(m_mapping_primitive.get())->AttachUserData(new MappingCRCCache(mapping_crc));
        crc32 = ON_CRC32(crc32, sizeof(mapping_crc), &mapping_crc);
      }
    }
  }
  else
  {
    // Jussi, Aug 18 2022, RH-69752: Surface mapping uvw transform has changed.
    // Changing crc makes sure existing models will show the correct mapping.
    crc32++;
  }

  crc32 = ON_CRC32(crc32,sizeof(m_uvw), &m_uvw);
  return crc32;
}